

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void isofile_connect_hardlink_files(iso9660_conflict *iso9660)

{
  isofile *piVar1;
  isofile *local_30;
  isofile *nf;
  isofile *target;
  hardlink *hl;
  archive_rb_node *n;
  iso9660_conflict *iso9660_local;
  
  for (hl = (hardlink *)
            __archive_rb_tree_iterate(&iso9660->hardlink_rbtree,(archive_rb_node *)0x0,0);
      hl != (hardlink *)0x0;
      hl = (hardlink *)__archive_rb_tree_iterate(&iso9660->hardlink_rbtree,&hl->rbnode,1)) {
    piVar1 = (hl->file_list).first;
    archive_entry_set_nlink(piVar1->entry,hl->nlink);
    for (local_30 = piVar1->hlnext; local_30 != (isofile *)0x0; local_30 = local_30->hlnext) {
      local_30->hardlink_target = piVar1;
      archive_entry_set_nlink(local_30->entry,hl->nlink);
    }
  }
  return;
}

Assistant:

static void
isofile_connect_hardlink_files(struct iso9660 *iso9660)
{
	struct archive_rb_node *n;
	struct hardlink *hl;
	struct isofile *target, *nf;

	ARCHIVE_RB_TREE_FOREACH(n, &(iso9660->hardlink_rbtree)) {
		hl = (struct hardlink *)n;

		/* The first entry must be a hardlink target. */
		target = hl->file_list.first;
		archive_entry_set_nlink(target->entry, hl->nlink);
		/* Set a hardlink target to reference entries. */
		for (nf = target->hlnext;
		    nf != NULL; nf = nf->hlnext) {
			nf->hardlink_target = target;
			archive_entry_set_nlink(nf->entry, hl->nlink);
		}
	}
}